

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixTriggerStep(DbFixer *pFix,TriggerStep *pStep)

{
  int iVar1;
  SrcList *local_28;
  Upsert *pUp;
  TriggerStep *pStep_local;
  DbFixer *pFix_local;
  
  pUp = (Upsert *)pStep;
  while( true ) {
    if (pUp == (Upsert *)0x0) {
      return 0;
    }
    iVar1 = sqlite3WalkSelect(&pFix->w,(Select *)pUp->pUpsertSet);
    if ((((iVar1 != 0) || (iVar1 = sqlite3WalkExpr(&pFix->w,*(Expr **)&pUp->isDoUpdate), iVar1 != 0)
         ) || (iVar1 = sqlite3WalkExprList(&pFix->w,(ExprList *)pUp->pToFree), iVar1 != 0)) ||
       (iVar1 = sqlite3FixSrcList(pFix,(SrcList *)pUp->pNextUpsert), iVar1 != 0)) break;
    for (local_28 = pUp->pUpsertSrc; local_28 != (SrcList *)0x0;
        local_28 = (SrcList *)local_28->a[0].zAlias) {
      iVar1 = sqlite3WalkExprList(&pFix->w,*(ExprList **)local_28);
      if (((iVar1 != 0) ||
          (iVar1 = sqlite3WalkExpr(&pFix->w,(Expr *)local_28->a[0].pSchema), iVar1 != 0)) ||
         ((iVar1 = sqlite3WalkExprList(&pFix->w,(ExprList *)local_28->a[0].zDatabase), iVar1 != 0 ||
          (iVar1 = sqlite3WalkExpr(&pFix->w,(Expr *)local_28->a[0].zName), iVar1 != 0)))) {
        return 1;
      }
    }
    pUp = *(Upsert **)&pUp->iIdxCur;
  }
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixTriggerStep(
  DbFixer *pFix,     /* Context of the fixation */
  TriggerStep *pStep /* The trigger step be fixed to one database */
){
  while( pStep ){
    if( sqlite3WalkSelect(&pFix->w, pStep->pSelect)
     || sqlite3WalkExpr(&pFix->w, pStep->pWhere)
     || sqlite3WalkExprList(&pFix->w, pStep->pExprList)
     || sqlite3FixSrcList(pFix, pStep->pFrom)
    ){
      return 1;
    }
#ifndef SQLITE_OMIT_UPSERT
    {
      Upsert *pUp;
      for(pUp=pStep->pUpsert; pUp; pUp=pUp->pNextUpsert){
        if( sqlite3WalkExprList(&pFix->w, pUp->pUpsertTarget)
         || sqlite3WalkExpr(&pFix->w, pUp->pUpsertTargetWhere)
         || sqlite3WalkExprList(&pFix->w, pUp->pUpsertSet)
         || sqlite3WalkExpr(&pFix->w, pUp->pUpsertWhere)
        ){
          return 1;
        }
      }
    }
#endif
    pStep = pStep->pNext;
  }

  return 0;
}